

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O3

Error __thiscall asmjit::Assembler::onDetach(Assembler *this,CodeHolder *code)

{
  Error EVar1;
  
  this->_section = (SectionEntry *)0x0;
  this->_bufferData = (uint8_t *)0x0;
  this->_bufferEnd = (uint8_t *)0x0;
  this->_bufferPtr = (uint8_t *)0x0;
  (this->_op4).field_0._packed[0] = (UInt64)0x0;
  (this->_op4).field_0._mem.field_2.offset64 = 0;
  (this->_op5).field_0._packed[0] = (UInt64)0x0;
  (this->_op5).field_0._mem.field_2.offset64 = 0;
  EVar1 = CodeEmitter::onDetach(&this->super_CodeEmitter,code);
  return EVar1;
}

Assistant:

Error Assembler::onDetach(CodeHolder* code) noexcept {
  _section    = nullptr;
  _bufferData = nullptr;
  _bufferEnd  = nullptr;
  _bufferPtr  = nullptr;

  _op4.reset();
  _op5.reset();

  return Base::onDetach(code);
}